

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void start_tracking(void)

{
  particle *ppVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  int iVar6;
  ostream *poVar7;
  reference pvVar8;
  cellp ***pppcVar9;
  long lVar10;
  int m_1;
  bool b_1;
  particle *p_1;
  particle *h_1;
  int x_1;
  int n_1;
  int z1_1;
  int y1_1;
  int x1_1;
  int i_1;
  int m;
  bool b;
  particle *p;
  particle *h;
  int x;
  int n;
  int i;
  int z2;
  int y2;
  int x2;
  int z1;
  int y1;
  int x1;
  long trn;
  int in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  bool bVar11;
  uint in_stack_ffffffffffffff43;
  uint uVar12;
  undefined1 in_stack_ffffffffffffff47;
  byte local_84;
  byte local_83;
  byte local_82;
  byte local_81;
  int local_78;
  undefined1 local_71;
  particle *local_70;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  byte local_41;
  particle *local_40;
  particle *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  if (mpi_rank == 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Tracking started for particles: ");
    poVar7 = std::operator<<(poVar7,(string *)particles_to_track_abi_cxx11_);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  if ((((((xtr1 < 0.0) || (xtr2 < 0.0)) || (ytr1 < 0.0)) || ((ytr2 < 0.0 || (ztr1 < 0.0)))) ||
      (ztr2 < 0.0)) ||
     (((xlength <= xtr1 || (xlength <= xtr2)) ||
      ((ylength <= ytr1 || (((ylength <= ytr2 || (zlength <= ztr1)) || (zlength <= ztr2)))))))) {
    if (mpi_rank == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Error - tracks outside of compulational domain");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    local_8 = 1;
    if ((tr_init & 1U) == 0) {
      local_c = -1;
      local_10 = 0;
      local_14 = 0;
      for (local_24 = 0; local_24 < n_tracks; local_24 = local_24 + 1) {
        local_18 = (int)((xtr1 + ((xtr2 - xtr1) * (double)local_24) / (double)n_tracks) / dx);
        local_1c = (int)((ytr1 + ((ytr2 - ytr1) * (double)local_24) / (double)n_tracks) / dy);
        local_20 = (int)((ztr1 + ((ztr2 - ztr1) * (double)local_24) / (double)n_tracks) / dz);
        if (((local_18 != local_c) || (local_1c != local_10)) || (local_20 != local_14)) {
          local_14 = local_20;
          local_10 = local_1c;
          local_c = local_18;
          local_28 = get_sr_for_index(CONCAT13((char)in_stack_ffffffffffffff43,
                                               CONCAT12(in_stack_ffffffffffffff42,
                                                        CONCAT11(in_stack_ffffffffffffff41,
                                                                 in_stack_ffffffffffffff40))));
          iVar6 = local_18;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_28);
          iVar6 = iVar6 - *pvVar8;
          local_2c = iVar6;
          if ((0 < local_28) && (iVar6 < nm)) {
            local_28 = local_28 + -1;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_28);
            local_2c = (iVar6 + *pvVar8) - nx_ich;
          }
          if (mpi_rank == local_28) {
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1483d6)
            ;
            pppcVar9 = field3d<cellp>::operator[]
                                 ((field3d<cellp> *)
                                  CONCAT17(in_stack_ffffffffffffff47,
                                           CONCAT43(in_stack_ffffffffffffff43,
                                                    CONCAT12(in_stack_ffffffffffffff42,
                                                             CONCAT11(in_stack_ffffffffffffff41,
                                                                      in_stack_ffffffffffffff40)))),
                                  in_stack_ffffffffffffff3c);
            local_40 = (*pppcVar9)[local_1c][local_20].pl.head;
            local_41 = 1;
            local_38 = local_40;
            lVar10 = std::__cxx11::string::find('(',0x65);
            if (lVar10 != -1) {
              while( true ) {
                local_81 = 0;
                if (local_40 != (particle *)0x0) {
                  local_81 = local_41;
                }
                if ((local_81 & 1) == 0) break;
                if ((local_40->cmr == -1.0) && (!NAN(local_40->cmr))) {
                  local_40->trn = (int)local_8;
                  local_8 = local_8 + 1;
                  local_41 = 0;
                }
                local_40 = local_40->next;
              }
            }
            lVar10 = std::__cxx11::string::find('(',0x70);
            if (lVar10 != -1) {
              local_40 = local_38;
              local_41 = 1;
              while( true ) {
                local_82 = 0;
                if (local_40 != (particle *)0x0) {
                  local_82 = local_41;
                }
                if (local_82 == 0) break;
                if ((local_40->cmr == 1.0) && (!NAN(local_40->cmr))) {
                  local_40->trn = (int)local_8;
                  local_8 = local_8 + 1;
                  local_41 = 0;
                }
                local_40 = local_40->next;
              }
            }
            lVar10 = std::__cxx11::string::find('(',0x67);
            if (lVar10 != -1) {
              local_40 = local_38;
              local_41 = 1;
              while( true ) {
                local_83 = 0;
                if (local_40 != (particle *)0x0) {
                  local_83 = local_41;
                }
                if (local_83 == 0) break;
                if ((local_40->cmr == 0.0) && (!NAN(local_40->cmr))) {
                  local_40->trn = (int)local_8;
                  local_8 = local_8 + 1;
                  local_41 = 0;
                }
                local_40 = local_40->next;
              }
            }
            lVar10 = std::__cxx11::string::find('(',0x69);
            if (lVar10 != -1) {
              for (local_48 = 0; local_48 < n_ion_populations; local_48 = local_48 + 1) {
                local_40 = local_38;
                local_41 = 1;
                while( true ) {
                  local_84 = 0;
                  if (local_40 != (particle *)0x0) {
                    local_84 = local_41;
                  }
                  if (local_84 == 0) break;
                  if ((local_40->cmr == icmr[local_48]) &&
                     (!NAN(local_40->cmr) && !NAN(icmr[local_48]))) {
                    local_40->trn = (int)local_8;
                    local_8 = local_8 + 1;
                    local_41 = 0;
                  }
                  local_40 = local_40->next;
                }
              }
            }
          }
          MPI_Bcast(&local_8,1,&ompi_mpi_long,local_28,&ompi_mpi_comm_world);
        }
      }
    }
    else {
      for (local_4c = 0; dVar3 = xtr1, local_4c < n_tracks; local_4c = local_4c + 1) {
        dVar2 = xtr2 - xtr1;
        iVar6 = rand();
        dVar5 = ytr1;
        local_50 = (int)((dVar3 + (dVar2 * (double)iVar6) / 2147483647.0) / dx);
        dVar3 = ytr2 - ytr1;
        iVar6 = rand();
        dVar2 = ztr1;
        local_54 = (int)((dVar5 + (dVar3 * (double)iVar6) / 2147483647.0) / dy);
        dVar3 = ztr2 - ztr1;
        iVar6 = rand();
        local_58 = (int)((dVar2 + (dVar3 * (double)iVar6) / 2147483647.0) / dz);
        MPI_Bcast(&local_50,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&local_54,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&local_58,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        local_5c = get_sr_for_index(CONCAT13((char)in_stack_ffffffffffffff43,
                                             CONCAT12(in_stack_ffffffffffffff42,
                                                      CONCAT11(in_stack_ffffffffffffff41,
                                                               in_stack_ffffffffffffff40))));
        iVar6 = local_50;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_5c);
        iVar6 = iVar6 - *pvVar8;
        if ((local_5c != 0) && (iVar6 < nm)) {
          local_5c = local_5c + -1;
          in_stack_ffffffffffffff43 = CONCAT31((int3)iVar6,(char)in_stack_ffffffffffffff43);
          in_stack_ffffffffffffff47 = (undefined1)((uint)iVar6 >> 0x18);
          std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_5c);
        }
        if (mpi_rank == local_5c) {
          std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                    ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1489d4);
          pppcVar9 = field3d<cellp>::operator[]
                               ((field3d<cellp> *)
                                CONCAT17(in_stack_ffffffffffffff47,
                                         CONCAT43(in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))),
                                in_stack_ffffffffffffff3c);
          ppVar1 = (*pppcVar9)[local_54][local_58].pl.head;
          local_71 = 1;
          lVar10 = std::__cxx11::string::find('(',0x65);
          local_70 = ppVar1;
          if (lVar10 != -1) {
            while( true ) {
              uVar12 = in_stack_ffffffffffffff43 & 0xffffff00;
              if (local_70 != (particle *)0x0) {
                uVar12 = CONCAT31((int3)(in_stack_ffffffffffffff43 >> 8),local_71);
              }
              in_stack_ffffffffffffff43 = uVar12;
              if ((uVar12 & 1) == 0) break;
              if ((local_70->cmr == -1.0) && (!NAN(local_70->cmr))) {
                local_70->trn = (int)local_8;
                local_8 = local_8 + 1;
                local_71 = 0;
              }
              local_70 = local_70->next;
            }
          }
          lVar10 = std::__cxx11::string::find('(',0x70);
          if (lVar10 != -1) {
            bVar4 = true;
            local_70 = ppVar1;
            while( true ) {
              bVar11 = false;
              if (local_70 != (particle *)0x0) {
                bVar11 = bVar4;
              }
              if (!bVar11) break;
              if ((local_70->cmr == 1.0) && (!NAN(local_70->cmr))) {
                local_70->trn = (int)local_8;
                local_8 = local_8 + 1;
                bVar4 = false;
              }
              local_70 = local_70->next;
            }
            in_stack_ffffffffffffff42 = 0;
          }
          lVar10 = std::__cxx11::string::find('(',0x67);
          if (lVar10 != -1) {
            bVar4 = true;
            local_70 = ppVar1;
            while( true ) {
              bVar11 = false;
              if (local_70 != (particle *)0x0) {
                bVar11 = bVar4;
              }
              if (!bVar11) break;
              if ((local_70->cmr == 0.0) && (!NAN(local_70->cmr))) {
                local_70->trn = (int)local_8;
                local_8 = local_8 + 1;
                bVar4 = false;
              }
              local_70 = local_70->next;
            }
            in_stack_ffffffffffffff41 = 0;
          }
          lVar10 = std::__cxx11::string::find('(',0x69);
          if (lVar10 != -1) {
            for (local_78 = 0; local_78 < n_ion_populations; local_78 = local_78 + 1) {
              bVar4 = true;
              local_70 = ppVar1;
              while( true ) {
                bVar11 = false;
                if (local_70 != (particle *)0x0) {
                  bVar11 = bVar4;
                }
                if (!bVar11) break;
                if ((local_70->cmr == icmr[local_78]) &&
                   (!NAN(local_70->cmr) && !NAN(icmr[local_78]))) {
                  local_70->trn = (int)local_8;
                  local_8 = local_8 + 1;
                  bVar4 = false;
                }
                local_70 = local_70->next;
              }
              in_stack_ffffffffffffff40 = 0;
            }
          }
        }
        MPI_Bcast(&local_8,1,&ompi_mpi_long,local_5c,&ompi_mpi_comm_world);
      }
    }
    synchronize_regions((bool)in_stack_ffffffffffffff47);
  }
  return;
}

Assistant:

void start_tracking()
{
    if (mpi_rank == 0) {
        cout << "Tracking started for particles: " << particles_to_track << endl;
    }
    if (xtr1 < 0 || xtr2 < 0 || ytr1 < 0 || ytr2 < 0 || ztr1 < 0 || ztr2 < 0 ||
        xtr1 >= xlength || xtr2 >= xlength || ytr1 >= ylength || ytr2 >= ylength || ztr1 >= zlength || ztr2 >= zlength)
    {
        if (mpi_rank == 0) {
            cout << "Error - tracks outside of compulational domain" << endl;
        }
        return;
    }
    long trn = 1; // trn = 0 for untracked particles
    if (tr_init==0) {
        int x1,y1,z1,x2,y2,z2;
        x1 = -1;
        y1 = 0;
        z1 = 0;
        for (int i=0;i<n_tracks;i++) {
            x2 = (xtr1 + (xtr2-xtr1)*i/n_tracks)/dx;
            y2 = (ytr1 + (ytr2-ytr1)*i/n_tracks)/dy;
            z2 = (ztr1 + (ztr2-ztr1)*i/n_tracks)/dz;
            if (x2!=x1 || y2!=y1 || z2!=z1) {
                x1 = x2;
                y1 = y2;
                z1 = z2;
                int n,x;
                n = get_sr_for_index(x2);
                x = x2 - x0_sr[n];
                if (n>0 && x<nm) {
                    n = n - 1;
                    x = x + nx_sr[n] - nx_ich;
                }
                if (mpi_rank == n) {
                    particle* h = psr->cp[x][y2][z2].pl.head;
                    particle* p = h;
                    bool b = 1;
                    if (particles_to_track.find('e') != string::npos)
                    {
                        while (p!=0 && b) {
                            if (p->cmr==-1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('p') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('g') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==0) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('i') != string::npos)
                    {
                        for (int m=0;m<n_ion_populations;m++) {
                            p = h;
                            b = 1;
                            while (p!=0 && b) {
                                if (p->cmr==icmr[m]) {
                                    p->trn = trn;
                                    trn++;
                                    b = 0;
                                }
                                p = p->next;
                            }
                        }
                    }
                }
                MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
            }
        }
    } else {
        for (int i=0;i<n_tracks;i++) {
            int x1 = ( xtr1 + ( xtr2 - xtr1 ) * rand( ) / RAND_MAX ) / dx;
            int y1 = ( ytr1 + ( ytr2 - ytr1 ) * rand( ) / RAND_MAX ) / dy;
            int z1 = ( ztr1 + ( ztr2 - ztr1 ) * rand( ) / RAND_MAX ) / dz;
            MPI_Bcast(&x1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&y1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&z1, 1, MPI_INT, 0, MPI_COMM_WORLD);

            int n,x;
            n = get_sr_for_index(x1);
            x = x1 - x0_sr[n];
            if (n!=0 && x<nm) {
                n = n - 1;
                x = x + nx_sr[n] - nx_ich;
            }
            if (mpi_rank == n) {
                particle* h = psr->cp[x][y1][z1].pl.head;
                particle* p = h;
                bool b = 1;
                if (particles_to_track.find('e') != string::npos)
                {
                    while (p!=0 && b) {
                        if (p->cmr==-1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('p') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('g') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==0) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('i') != string::npos)
                {
                    for (int m=0;m<n_ion_populations;m++) {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==icmr[m]) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                }
            }
            MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
        }
    }

    // make the same particles tracked in all regions, so that tracks aren't lost at the first exchange
    synchronize_regions(false);
}